

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  uint err;
  SessionHandle *data_00;
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  int *piVar6;
  timeval tVar7;
  __time_t local_120;
  __suseconds_t local_118;
  long local_110;
  long port;
  char ipaddress [46];
  CURLcode res;
  curl_socket_t sockfd;
  SessionHandle *data;
  _Bool isconnected;
  int error;
  int rc;
  Curl_sockaddr_ex addr;
  curl_socket_t *sockp_local;
  Curl_addrinfo *ai_local;
  connectdata *conn_local;
  
  bVar1 = false;
  data_00 = conn->data;
  ipaddress[0x28] = '\0';
  ipaddress[0x29] = '\0';
  ipaddress[0x2a] = '\0';
  ipaddress[0x2b] = '\0';
  *sockp = -1;
  addr._sa_ex_u._120_8_ = sockp;
  ipaddress._40_4_ =
       Curl_socket(conn,ai,(Curl_sockaddr_ex *)&error,(curl_socket_t *)(ipaddress + 0x2c));
  if (ipaddress._40_4_ == CURLE_OK) {
    _Var2 = getaddressinfo((sockaddr *)&addr.protocol,(char *)&port,&local_110);
    if (_Var2) {
      Curl_infof(data_00,"  Trying %s...\n",&port);
      if (((data_00->set).tcp_nodelay & 1U) != 0) {
        tcpnodelay(conn,stack0xffffffffffffff2c);
      }
      if (((data_00->set).tcp_keepalive & 1U) != 0) {
        tcpkeepalive(data_00,stack0xffffffffffffff2c);
      }
      if ((data_00->set).fsockopt != (curl_sockopt_callback)0x0) {
        iVar3 = (*(data_00->set).fsockopt)
                          ((data_00->set).sockopt_client,stack0xffffffffffffff2c,CURLSOCKTYPE_IPCXN)
        ;
        if (iVar3 == 2) {
          bVar1 = true;
        }
        else if (iVar3 != 0) {
          Curl_closesocket(conn,stack0xffffffffffffff2c);
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      ipaddress._40_4_ = bindlocal(conn,stack0xffffffffffffff2c,error);
      if (ipaddress._40_4_ == CURLE_OK) {
        curlx_nonblock(stack0xffffffffffffff2c,1);
        tVar7 = curlx_tvnow();
        local_120 = tVar7.tv_sec;
        (conn->connecttime).tv_sec = local_120;
        local_118 = tVar7.tv_usec;
        (conn->connecttime).tv_usec = local_118;
        if (1 < conn->num_addr) {
          Curl_expire_latest(data_00,conn->timeoutms_per_addr);
        }
        if ((bVar1) || (conn->socktype != 1)) {
          *(curl_socket_t *)addr._sa_ex_u._120_8_ = stack0xffffffffffffff2c;
          conn_local._4_4_ = CURLE_OK;
        }
        else {
          iVar3 = connect(stack0xffffffffffffff2c,(sockaddr *)&addr.protocol,addr.socktype);
          if (iVar3 == -1) {
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            if ((iVar3 == 0xb) || (iVar3 == 0x73)) {
              ipaddress[0x28] = '\0';
              ipaddress[0x29] = '\0';
              ipaddress[0x2a] = '\0';
              ipaddress[0x2b] = '\0';
            }
            else {
              pcVar5 = Curl_strerror(conn,iVar3);
              Curl_infof(data_00,"Immediate connect fail for %s: %s\n",&port,pcVar5);
              (data_00->state).os_errno = iVar3;
              Curl_closesocket(conn,stack0xffffffffffffff2c);
              ipaddress[0x28] = '\a';
              ipaddress[0x29] = '\0';
              ipaddress[0x2a] = '\0';
              ipaddress[0x2b] = '\0';
            }
          }
          if (ipaddress._40_4_ == 0) {
            *(curl_socket_t *)addr._sa_ex_u._120_8_ = stack0xffffffffffffff2c;
          }
          conn_local._4_1_ = ipaddress[0x28];
          conn_local._5_1_ = ipaddress[0x29];
          conn_local._6_1_ = ipaddress[0x2a];
          conn_local._7_1_ = ipaddress[0x2b];
        }
      }
      else {
        Curl_closesocket(conn,stack0xffffffffffffff2c);
        if (ipaddress._40_4_ == 1) {
          conn_local._4_4_ = CURLE_OK;
        }
        else {
          conn_local._4_1_ = ipaddress[0x28];
          conn_local._5_1_ = ipaddress[0x29];
          conn_local._6_1_ = ipaddress[0x2a];
          conn_local._7_1_ = ipaddress[0x2b];
        }
      }
    }
    else {
      puVar4 = (uint *)__errno_location();
      err = *puVar4;
      pcVar5 = Curl_strerror(conn,err);
      Curl_failf(data_00,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)err,pcVar5);
      Curl_closesocket(conn,stack0xffffffffffffff2c);
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode
singleipconnect(struct connectdata *conn,
                const Curl_addrinfo *ai,
                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode res = CURLE_OK;
  char ipaddress[MAX_IPADR_LEN];
  long port;

  *sockp = CURL_SOCKET_BAD;

  res = Curl_socket(conn, ai, &addr, &sockfd);
  if(res)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

  if(data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  res = bindlocal(conn, sockfd, addr.family);
  if(res) {
    Curl_closesocket(conn, sockfd); /* close socket and bail out */
    if(res == CURLE_UNSUPPORTED_PROTOCOL) {
      /* The address family is not supported on this interface.
         We can continue trying addresses */
      return CURLE_OK;
    }
    return res;
  }

  /* set socket non-blocking */
  curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      res = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn,error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      res = CURLE_COULDNT_CONNECT;
    }
  }

  if(!res)
    *sockp = sockfd;

  return res;
}